

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeRangeTestCase.cpp
# Opt level: O2

void __thiscall SuiteTimeRangeTests::TestisInSameRange::RunImpl(TestisInSameRange *this)

{
  TestResults *pTVar1;
  bool bVar2;
  TestResults **ppTVar3;
  TestDetails **ppTVar4;
  TestDetails local_b0;
  UtcTimeStamp time2;
  UtcTimeStamp time1;
  UtcTimeOnly end;
  UtcTimeOnly start;
  
  FIX::UtcTimeOnly::UtcTimeOnly(&start,3,0,0,0);
  FIX::UtcTimeOnly::UtcTimeOnly(&end,0x12,0,0,0);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&time1.super_DateTime,10,0,0,10,10,2000);
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&time2.super_DateTime,10,0,0,10,10,2000);
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xbb);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xbc);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,0,0,10,10,2000);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0xb,0,0,10,10,2000);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xc1);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xc2);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0xb,0,0,10,10,2000);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,0,0,10,10,2000);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,199);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,200);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x13,0,0,10,10,2000);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,0,0,10,10,2000);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xcd);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xce);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,10,0,0,10,10,2000);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,2,0,0,10,10,2000);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xd3);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xd4);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,0x12,0,0,0);
  start.super_DateTime._8_8_ = local_b0.testName;
  start.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,3,0,0,0);
  end.super_DateTime._8_8_ = local_b0.testName;
  end.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x13,0,0,10,10,2000);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x14,0,0,10,10,2000);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xdd);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xde);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x13,0,0,10,10,2000);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,2,0,0,0xb,10,2000);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xe3);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xe4);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,2,0,0,0xb,10,2000);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x13,0,0,10,10,2000);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xe9);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (!bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xea);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x15,0,0,0xb,10,2000);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x14,0,0,10,10,2000);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xef);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xf0);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,6,0,0,0);
  start.super_DateTime._8_8_ = local_b0.testName;
  start.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeOnly::UtcTimeOnly((UtcTimeOnly *)&local_b0,6,0,0,0);
  end.super_DateTime._8_8_ = local_b0.testName;
  end.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x13,10,0,1,0xd,0x7d4);
  time1.super_DateTime._8_8_ = local_b0.testName;
  time1.super_DateTime.m_time = (int64_t)local_b0.filename;
  FIX::UtcTimeStamp::UtcTimeStamp((UtcTimeStamp *)&local_b0,0x13,6,0,1,0xe,0x7d4);
  time2.super_DateTime._8_8_ = local_b0.testName;
  time2.super_DateTime.m_time = (int64_t)local_b0.filename;
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time1.super_DateTime,&time2.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xf7);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"!TimeRange::isInSameRange( start, end, time1, time2 )");
  }
  bVar2 = FIX::TimeRange::isInSameRange(&start,&end,&time2.super_DateTime,&time1.super_DateTime);
  if (bVar2) {
    ppTVar3 = UnitTest::CurrentTest::Results();
    pTVar1 = *ppTVar3;
    ppTVar4 = UnitTest::CurrentTest::Details();
    UnitTest::TestDetails::TestDetails(&local_b0,*ppTVar4,0xf8);
    UnitTest::TestResults::OnTestFailure
              (pTVar1,&local_b0,"!TimeRange::isInSameRange( start, end, time2, time1 )");
  }
  return;
}

Assistant:

TEST(isInSameRange)
{
  // start time is less than end time
  UtcTimeOnly start( 3, 0, 0 );
  UtcTimeOnly end( 18, 0, 0 );

  // same time
  UtcTimeStamp time1( 10, 0, 0, 10, 10, 2000 );
  UtcTimeStamp time2( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 in same session but greater
  time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 in same session but less
  time1 = UtcTimeStamp( 11, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 1 not in session
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 2 not in session
  time1 = UtcTimeStamp( 10, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 2, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // start time is greater than end time
  start = UtcTimeOnly( 18, 0, 0 );
  end = UtcTimeOnly( 3, 0, 0 );

  // same session same day
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 20, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // same session time 2 is in next day
  time1 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  time2 = UtcTimeStamp( 2, 0, 0, 11, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // same session time 1 is in next day
  time1 = UtcTimeStamp( 2, 0, 0, 11, 10, 2000 );
  time2 = UtcTimeStamp( 19, 0, 0, 10, 10, 2000 );
  CHECK( TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( TimeRange::isInSameRange( start, end, time2, time1 ) );

  // time 1 is 25 hours greater than time 2
  time1 = UtcTimeStamp( 21, 0, 0, 11, 10, 2000 );
  time2 = UtcTimeStamp( 20, 0, 0, 10, 10, 2000 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );

  // start time is greater than end time
  start = UtcTimeOnly( 6, 0, 0 );
  end = UtcTimeOnly( 6, 0, 0 );
  time1 = UtcTimeStamp( 19, 10, 0, 1, 13, 2004 );
  time2 = UtcTimeStamp( 19, 06, 0, 1, 14, 2004 );
  CHECK( !TimeRange::isInSameRange( start, end, time1, time2 ) );
  CHECK( !TimeRange::isInSameRange( start, end, time2, time1 ) );
}